

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

TString * loadStringN(LoadState *S,Proto *p)

{
  lua_State *L_00;
  StkId pSVar1;
  size_t sVar2;
  ulong l;
  TString *x_;
  TValue *io;
  char buff [40];
  size_t size;
  TString *ts;
  lua_State *L;
  Proto *p_local;
  LoadState *S_local;
  
  L_00 = S->L;
  sVar2 = loadSize(S);
  if (sVar2 == 0) {
    S_local = (LoadState *)0x0;
  }
  else {
    l = sVar2 - 1;
    if (l < 0x29) {
      loadBlock(S,&io,l);
      size = (size_t)luaS_newlstr(L_00,(char *)&io,l);
    }
    else {
      size = (size_t)luaS_createlngstrobj(L_00,l);
      pSVar1 = (L_00->top).p;
      *(size_t *)pSVar1 = size;
      (pSVar1->val).tt_ = ((TString *)size)->tt | 0x40;
      luaD_inctop(L_00);
      loadBlock(S,((TString *)size)->contents,l);
      (L_00->top).p = (StkId)((L_00->top).offset + -0x10);
    }
    if (((p->marked & 0x20) != 0) && ((*(byte *)(size + 9) & 0x18) != 0)) {
      luaC_barrier_(L_00,(GCObject *)p,(GCObject *)size);
    }
    S_local = (LoadState *)size;
  }
  return (TString *)S_local;
}

Assistant:

static TString *loadStringN (LoadState *S, Proto *p) {
  lua_State *L = S->L;
  TString *ts;
  size_t size = loadSize(S);
  if (size == 0)  /* no string? */
    return NULL;
  else if (--size <= LUAI_MAXSHORTLEN) {  /* short string? */
    char buff[LUAI_MAXSHORTLEN];
    loadVector(S, buff, size);  /* load string into buffer */
    ts = luaS_newlstr(L, buff, size);  /* create string */
  }
  else {  /* long string */
    ts = luaS_createlngstrobj(L, size);  /* create string */
    setsvalue2s(L, L->top.p, ts);  /* anchor it ('loadVector' can GC) */
    luaD_inctop(L);
    loadVector(S, getstr(ts), size);  /* load directly in final place */
    L->top.p--;  /* pop string */
  }
  luaC_objbarrier(L, p, ts);
  return ts;
}